

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

StorageClass __thiscall
spirv_cross::CompilerGLSL::get_expression_effective_storage_class(CompilerGLSL *this,uint32_t ptr)

{
  Variant *pVVar1;
  bool bVar2;
  int iVar3;
  SPIRVariable *pSVar4;
  SPIRExpression *pSVar5;
  SPIRType *pSVar6;
  size_type sVar7;
  StorageClass SVar8;
  uint local_1c;
  
  local_1c = ptr;
  pSVar4 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr);
  pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  if ((pVVar1[local_1c].type == TypeExpression) &&
     (pSVar5 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + local_1c),
     pSVar5->access_chain == false)) {
    sVar7 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).forced_temporaries._M_h,&local_1c);
    bVar2 = true;
    if (sVar7 == 0) {
      sVar7 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->super_Compiler).forwarded_temporaries._M_h,&local_1c);
      bVar2 = sVar7 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((pSVar4 == (SPIRVariable *)0x0) || (bVar2)) {
    pSVar6 = Compiler::expression_type(&this->super_Compiler,local_1c);
    SVar8 = pSVar6->storage;
  }
  else {
    SVar8 = StorageClassWorkgroup;
    iVar3 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,pSVar4,4);
    if ((char)iVar3 == '\0') {
      SVar8 = StorageClassStorageBuffer;
      iVar3 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,pSVar4,0xc);
      if ((char)iVar3 == '\0') {
        if (pSVar4->storage == StorageClassUniform) {
          pSVar6 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + *(uint *)&(pSVar4->super_IVariant).field_0xc);
          bVar2 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(pSVar6->super_IVariant).self.id,
                             DecorationBufferBlock);
          if (bVar2) {
            return StorageClassStorageBuffer;
          }
        }
        SVar8 = pSVar4->storage;
      }
    }
  }
  return SVar8;
}

Assistant:

StorageClass CompilerGLSL::get_expression_effective_storage_class(uint32_t ptr)
{
	auto *var = maybe_get_backing_variable(ptr);

	// If the expression has been lowered to a temporary, we need to use the Generic storage class.
	// We're looking for the effective storage class of a given expression.
	// An access chain or forwarded OpLoads from such access chains
	// will generally have the storage class of the underlying variable, but if the load was not forwarded
	// we have lost any address space qualifiers.
	bool forced_temporary = ir.ids[ptr].get_type() == TypeExpression && !get<SPIRExpression>(ptr).access_chain &&
	                        (forced_temporaries.count(ptr) != 0 || forwarded_temporaries.count(ptr) == 0);

	if (var && !forced_temporary)
	{
		if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
			return StorageClassWorkgroup;
		if (variable_decl_is_remapped_storage(*var, StorageClassStorageBuffer))
			return StorageClassStorageBuffer;

		// Normalize SSBOs to StorageBuffer here.
		if (var->storage == StorageClassUniform &&
		    has_decoration(get<SPIRType>(var->basetype).self, DecorationBufferBlock))
			return StorageClassStorageBuffer;
		else
			return var->storage;
	}
	else
		return expression_type(ptr).storage;
}